

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_trc.c
# Opt level: O0

void trc_infof(Curl_easy *data,curl_trc_feat *feat,char *fmt,__va_list_tag *ap)

{
  int iVar1;
  long lVar2;
  char local_838 [8];
  char buffer [2053];
  int len;
  __va_list_tag *ap_local;
  char *fmt_local;
  curl_trc_feat *feat_local;
  Curl_easy *data_local;
  
  stack0xffffffffffffffd4 = 0;
  if (feat != (curl_trc_feat *)0x0) {
    register0x00000000 = curl_msnprintf(local_838,0x801,"[%s] ",feat->name);
  }
  iVar1 = curl_mvsnprintf(local_838 + stack0xffffffffffffffd4,
                          (long)(0x801 - stack0xffffffffffffffd4),fmt,ap);
  register0x00000000 = iVar1 + stack0xffffffffffffffd4;
  if (0x7ff < register0x00000000) {
    local_838[register0x00000000 + -1] = '.';
    lVar2 = (long)stack0xffffffffffffffd4;
    unique0x1000013d = stack0xffffffffffffffd4 + 1;
    local_838[lVar2] = '.';
    lVar2 = (long)stack0xffffffffffffffd4;
    unique0x10000141 = stack0xffffffffffffffd4 + 1;
    local_838[lVar2] = '.';
  }
  lVar2 = (long)stack0xffffffffffffffd4;
  unique0x10000145 = stack0xffffffffffffffd4 + 1;
  local_838[lVar2] = '\n';
  local_838[stack0xffffffffffffffd4] = '\0';
  Curl_debug(data,CURLINFO_TEXT,local_838,(long)stack0xffffffffffffffd4);
  return;
}

Assistant:

static void trc_infof(struct Curl_easy *data, struct curl_trc_feat *feat,
                      const char * const fmt, va_list ap)
{
  int len = 0;
  char buffer[MAXINFO + 5];
  if(feat)
    len = msnprintf(buffer, (MAXINFO + 1), "[%s] ", feat->name);
  len += mvsnprintf(buffer + len, (MAXINFO + 1) - len, fmt, ap);
  if(len >= MAXINFO) { /* too long, shorten with '...' */
    --len;
    buffer[len++] = '.';
    buffer[len++] = '.';
    buffer[len++] = '.';
  }
  buffer[len++] = '\n';
  buffer[len] = '\0';
  Curl_debug(data, CURLINFO_TEXT, buffer, len);
}